

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O2

int erkStep_ComputeSolutions(ARKodeMem ark_mem,sunrealtype *dsmPtr)

{
  void *pvVar1;
  N_Vector p_Var2;
  N_Vector p_Var3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  sunrealtype sVar10;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    arkProcessError(ark_mem,-0x15,0x3e3,"erkStep_ComputeSolutions",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep.c"
                    ,"Time step module memory is NULL.");
    iVar9 = -0x15;
  }
  else {
    p_Var2 = ark_mem->ycur;
    p_Var3 = ark_mem->tempv1;
    lVar4 = *(long *)((long)pvVar1 + 0x30);
    lVar5 = *(long *)((long)pvVar1 + 0x38);
    *dsmPtr = 0.0;
    uVar8 = 0;
    uVar7 = (ulong)*(uint *)((long)pvVar1 + 0x18);
    if ((int)*(uint *)((long)pvVar1 + 0x18) < 1) {
      uVar7 = uVar8;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      *(double *)(lVar4 + uVar8 * 8) =
           ark_mem->h * *(double *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + 0x20) + uVar8 * 8);
      *(undefined8 *)(lVar5 + uVar8 * 8) = *(undefined8 *)(*(long *)((long)pvVar1 + 8) + uVar8 * 8);
    }
    *(undefined8 *)(lVar4 + uVar7 * 8) = 0x3ff0000000000000;
    *(N_Vector *)(lVar5 + uVar7 * 8) = ark_mem->yn;
    iVar6 = N_VLinearCombination((int)uVar7 + 1,lVar4,lVar5,p_Var2);
    iVar9 = -0x1c;
    if ((iVar6 == 0) && (iVar9 = 0, ark_mem->fixedstep == 0)) {
      uVar8 = 0;
      uVar7 = (ulong)*(uint *)((long)pvVar1 + 0x18);
      if ((int)*(uint *)((long)pvVar1 + 0x18) < 1) {
        uVar7 = uVar8;
      }
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        *(double *)(lVar4 + uVar8 * 8) =
             (*(double *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + 0x20) + uVar8 * 8) -
             *(double *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + 0x28) + uVar8 * 8)) * ark_mem->h
        ;
        *(undefined8 *)(lVar5 + uVar8 * 8) =
             *(undefined8 *)(*(long *)((long)pvVar1 + 8) + uVar8 * 8);
      }
      iVar6 = N_VLinearCombination(uVar7,lVar4,lVar5,p_Var3);
      iVar9 = -0x1c;
      if (iVar6 == 0) {
        sVar10 = (sunrealtype)N_VWrmsNorm(p_Var3,ark_mem->ewt);
        *dsmPtr = sVar10;
        iVar9 = 0;
      }
    }
  }
  return iVar9;
}

Assistant:

int erkStep_ComputeSolutions(ARKodeMem ark_mem, sunrealtype* dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  ARKodeERKStepMem step_mem;

  /* access ARKodeERKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ERKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeERKStepMem)ark_mem->step_mem;

  /* set N_Vector shortcuts */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;

  /* Compute time step solution */
  /*   set arrays for fused vector operation */
  nvec = 0;
  for (j = 0; j < step_mem->stages; j++)
  {
    cvals[nvec] = ark_mem->h * step_mem->B->b[j];
    Xvecs[nvec] = step_mem->F[j];
    nvec += 1;
  }
  cvals[nvec] = ONE;
  Xvecs[nvec] = ark_mem->yn;
  nvec += 1;

  /*   call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep)
  {
    /* set arrays for fused vector operation */
    nvec = 0;
    for (j = 0; j < step_mem->stages; j++)
    {
      cvals[nvec] = ark_mem->h * (step_mem->B->b[j] - step_mem->B->d[j]);
      Xvecs[nvec] = step_mem->F[j];
      nvec += 1;
    }

    /* call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }

    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return (ARK_SUCCESS);
}